

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_io_SslCtx.cpp
# Opt level: O0

bool __thiscall
axl::io::SslCtx::loadVerifyLocations(SslCtx *this,StringRef *caFileName,StringRef *caDir)

{
  SSL_CTX *ctx;
  bool bVar1;
  C *CApath;
  StringRefBase<char,_axl::sl::StringDetailsBase<char>_> *in_RDX;
  StringRefBase<char,_axl::sl::StringDetailsBase<char>_> *in_RSI;
  undefined8 *in_RDI;
  int result;
  StringRefBase<char,_axl::sl::StringDetailsBase<char>_> *in_stack_ffffffffffffffc0;
  undefined8 local_30;
  
  ctx = (SSL_CTX *)*in_RDI;
  bVar1 = sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::isEmpty(in_RSI);
  if (bVar1) {
    local_30 = (char *)0x0;
  }
  else {
    local_30 = sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::sz
                         (in_stack_ffffffffffffffc0);
  }
  bVar1 = sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::isEmpty(in_RDX);
  if (bVar1) {
    CApath = (char *)0x0;
  }
  else {
    CApath = sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::sz
                       (in_stack_ffffffffffffffc0);
  }
  SSL_CTX_load_verify_locations(ctx,local_30,CApath);
  bVar1 = cry::completeWithLastCryptoError(0);
  return bVar1;
}

Assistant:

bool
SslCtx::loadVerifyLocations(
	const sl::StringRef& caFileName,
	const sl::StringRef& caDir
) {
	ASSERT(m_h);

	int result = ::SSL_CTX_load_verify_locations(
		m_h,
		!caFileName.isEmpty() ? caFileName.sz() : NULL,
		!caDir.isEmpty() ? caDir.sz() : NULL
	);

	return cry::completeWithLastCryptoError(result > 0);
}